

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

int num_extinctions(void)

{
  int local_10;
  int local_c;
  int n;
  int i;
  
  local_10 = 0;
  for (local_c = 0; local_c < 0x193; local_c = local_c + 1) {
    if (((mvitals[local_c].mvflags & 3) != 0) && ((mons[local_c].geno & 0x1000) == 0)) {
      local_10 = local_10 + 1;
    }
  }
  return local_10;
}

Assistant:

int num_extinctions(void)
{
    int i, n = 0;

    for (i = LOW_PM; i < NUMMONS; i++)
	if ((mvitals[i].mvflags & G_GONE) && !(mons[i].geno & G_UNIQ))
	    n++;

    return n;
}